

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

void __thiscall
kj::MainBuilder::Impl::Impl
          (Impl *this,ProcessContext *context,StringPtr version,StringPtr briefDescription,
          StringPtr extendedDescription)

{
  ProcessContext *context_local;
  Impl *this_local;
  StringPtr briefDescription_local;
  StringPtr version_local;
  
  this->context = context;
  (this->version).content.ptr = version.content.ptr;
  (this->version).content.size_ = version.content.size_;
  (this->briefDescription).content.ptr = briefDescription.content.ptr;
  (this->briefDescription).content.size_ = briefDescription.content.size_;
  (this->extendedDescription).content.ptr = extendedDescription.content.ptr;
  (this->extendedDescription).content.size_ = extendedDescription.content.size_;
  Arena::Arena(&this->arena,0x400);
  std::
  map<char,_kj::MainBuilder::Impl::Option_*,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
  ::map(&this->shortOptions);
  std::
  map<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*,_std::less<kj::ArrayPtr<const_char>_>,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
  ::map(&this->longOptions);
  std::
  map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
  ::map(&this->subCommands);
  Vector<kj::MainBuilder::Impl::Arg>::Vector(&this->args);
  Maybe<kj::Function<kj::MainBuilder::Validity_()>_>::Maybe(&this->finalCallback);
  return;
}

Assistant:

inline Impl(ProcessContext& context, StringPtr version,
              StringPtr briefDescription, StringPtr extendedDescription)
      : context(context), version(version),
        briefDescription(briefDescription), extendedDescription(extendedDescription) {}